

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

int parse_and_tune(regex_t *reg,OnigUChar *pattern,OnigUChar *pattern_end,ParseEnv *scan_env,
                  Node **rroot,OnigErrorInfo *einfo,UnsetAddrList *uslist)

{
  int iVar1;
  OnigEncoding local_50;
  Node *root;
  OnigErrorInfo *pOStack_40;
  int r;
  OnigErrorInfo *einfo_local;
  Node **rroot_local;
  ParseEnv *scan_env_local;
  OnigUChar *pattern_end_local;
  OnigUChar *pattern_local;
  regex_t *reg_local;
  
  local_50 = (OnigEncoding)0x0;
  if (einfo != (OnigErrorInfo *)0x0) {
    einfo->enc = reg->enc;
    einfo->par = (OnigUChar *)0x0;
  }
  pOStack_40 = einfo;
  einfo_local = (OnigErrorInfo *)rroot;
  rroot_local = (Node **)scan_env;
  scan_env_local = (ParseEnv *)pattern_end;
  pattern_end_local = pattern;
  pattern_local = (OnigUChar *)reg;
  root._4_4_ = onig_parse_tree((Node **)&local_50,pattern,pattern_end,reg,scan_env);
  if ((root._4_4_ != 0) ||
     (((*(uint *)((long)rroot_local + 0x10c) & 2) != 0 &&
      (root._4_4_ = check_whole_options_position((Node *)local_50), root._4_4_ != 0))))
  goto LAB_00123cd5;
  root._4_4_ = 0;
  root._4_4_ = reduce_string_list((Node *)local_50,*(OnigEncoding *)(pattern_local + 0x60));
  if (root._4_4_ != 0) goto LAB_00123cd5;
  iVar1 = 0;
  if (((0 < *(int *)(rroot_local + 0xb)) &&
      (((undefined1  [72])rroot_local[2]->u & (undefined1  [72])0x80) != (undefined1  [72])0x0)) &&
     ((*(uint *)(pattern_local + 0x68) & 0x100) == 0)) {
    if (*(int *)(rroot_local + 0xb) == *(int *)((long)rroot_local + 0x54)) {
      root._4_4_ = numbered_ref_check((Node *)local_50);
    }
    else {
      root._4_4_ = disable_noname_group_capture
                             ((Node **)&local_50,(regex_t *)pattern_local,(ParseEnv *)rroot_local);
    }
    iVar1 = root._4_4_;
    if (root._4_4_ != 0) goto LAB_00123cd5;
  }
  root._4_4_ = iVar1;
  root._4_4_ = check_backrefs((Node *)local_50,(ParseEnv *)rroot_local);
  if (root._4_4_ != 0) goto LAB_00123cd5;
  iVar1 = 0;
  if (*(int *)(rroot_local + 10) < 1) {
LAB_00123c3b:
    root._4_4_ = iVar1;
    *(undefined4 *)(pattern_local + 0x3c) = *(undefined4 *)(rroot_local + 10);
    root._4_4_ = tune_tree((Node *)local_50,(regex_t *)pattern_local,0,(ParseEnv *)rroot_local);
    if (root._4_4_ == 0) {
      iVar1 = 0;
      if (*(int *)(rroot_local + 0x1d) == 0) {
LAB_00123caa:
        root._4_4_ = iVar1;
        einfo_local->enc = local_50;
        return root._4_4_;
      }
      set_parent_node_trav((Node *)local_50,(Node *)0x0);
      root._4_4_ = set_empty_repeat_node_trav((Node *)local_50,(Node *)0x0,(ParseEnv *)rroot_local);
      if (root._4_4_ == 0) {
        set_empty_status_check_trav((Node *)local_50,(ParseEnv *)rroot_local);
        iVar1 = root._4_4_;
        goto LAB_00123caa;
      }
    }
  }
  else {
    root._4_4_ = unset_addr_list_init(uslist,*(int *)(rroot_local + 10));
    if (root._4_4_ != 0) goto LAB_00123cd5;
    rroot_local[0x20] = (Node *)uslist;
    root._4_4_ = tune_call((Node *)local_50,(ParseEnv *)rroot_local,0);
    if (((root._4_4_ == 0) && (root._4_4_ = tune_call2((Node *)local_50), root._4_4_ == 0)) &&
       ((root._4_4_ = recursive_call_check_trav((Node *)local_50,(ParseEnv *)rroot_local,0),
        -1 < root._4_4_ &&
        (root._4_4_ = infinite_recursive_call_check_trav((Node *)local_50,(ParseEnv *)rroot_local),
        root._4_4_ == 0)))) {
      tune_called_state((Node *)local_50,0);
      iVar1 = root._4_4_;
      goto LAB_00123c3b;
    }
  }
  if (0 < *(int *)(rroot_local + 10)) {
    unset_addr_list_end(uslist);
  }
LAB_00123cd5:
  if ((rroot_local[7] != (Node *)0x0) && (pOStack_40 != (OnigErrorInfo *)0x0)) {
    pOStack_40->par = (OnigUChar *)rroot_local[7];
    pOStack_40->par_end = (OnigUChar *)rroot_local[8];
  }
  onig_node_free((Node *)local_50);
  if (rroot_local[0x1c] != (Node *)0x0) {
    free(rroot_local[0x1c]);
  }
  einfo_local->enc = (OnigEncoding)0x0;
  return root._4_4_;
}

Assistant:

static int parse_and_tune(regex_t* reg, const UChar* pattern,
  const UChar* pattern_end, ParseEnv *scan_env, Node** rroot,
  OnigErrorInfo* einfo
#ifdef USE_CALL
  , UnsetAddrList* uslist
#endif
)
{
  int r;
  Node* root;

  root = NULL_NODE;
  if (IS_NOT_NULL(einfo)) {
    einfo->enc = reg->enc;
    einfo->par = (UChar* )NULL;
  }

  r = onig_parse_tree(&root, pattern, pattern_end, reg, scan_env);
  if (r != 0) goto err;

#ifdef USE_WHOLE_OPTIONS
  if ((scan_env->flags & PE_FLAG_HAS_WHOLE_OPTIONS) != 0) {
    r = check_whole_options_position(root);
    if (r != 0) goto err;
  }
#endif

  r = reduce_string_list(root, reg->enc);
  if (r != 0) goto err;

  /* mixed use named group and no-named group */
  if (scan_env->num_named > 0 &&
      IS_SYNTAX_BV(scan_env->syntax, ONIG_SYN_CAPTURE_ONLY_NAMED_GROUP) &&
      ! OPTON_CAPTURE_GROUP(reg->options)) {
    if (scan_env->num_named != scan_env->num_mem)
      r = disable_noname_group_capture(&root, reg, scan_env);
    else
      r = numbered_ref_check(root);

    if (r != 0) goto err;
  }

  r = check_backrefs(root, scan_env);
  if (r != 0) goto err;

#ifdef USE_CALL
  if (scan_env->num_call > 0) {
    r = unset_addr_list_init(uslist, scan_env->num_call);
    if (r != 0) goto err;
    scan_env->unset_addr_list = uslist;
    r = tune_call(root, scan_env, 0);
    if (r != 0) goto err_unset;
    r = tune_call2(root);
    if (r != 0) goto err_unset;
    r = recursive_call_check_trav(root, scan_env, 0);
    if (r  < 0) goto err_unset;
    r = infinite_recursive_call_check_trav(root, scan_env);
    if (r != 0) goto err_unset;

    tune_called_state(root, 0);
  }

  reg->num_call = scan_env->num_call;
#endif

#ifdef ONIG_DEBUG_PARSE
  fprintf(DBGFP, "MAX PARSE DEPTH: %d\n", scan_env->max_parse_depth);
#endif

  r = tune_tree(root, reg, 0, scan_env);
  if (r != 0) {
#ifdef ONIG_DEBUG_PARSE
    fprintf(DBGFP, "TREE (error in tune)\n");
    print_tree(DBGFP, root);
    fprintf(DBGFP, "\n");
#endif
    goto err_unset;
  }

  if (scan_env->backref_num != 0) {
    set_parent_node_trav(root, NULL_NODE);
    r = set_empty_repeat_node_trav(root, NULL_NODE, scan_env);
    if (r != 0) goto err_unset;
    set_empty_status_check_trav(root, scan_env);
  }

  *rroot = root;
  return r;

 err_unset:
#ifdef USE_CALL
  if (scan_env->num_call > 0) {
    unset_addr_list_end(uslist);
  }
#endif
 err:
  if (IS_NOT_NULL(scan_env->error)) {
    if (IS_NOT_NULL(einfo)) {
      einfo->par     = scan_env->error;
      einfo->par_end = scan_env->error_end;
    }
  }

  onig_node_free(root);
  if (IS_NOT_NULL(scan_env->mem_env_dynamic))
    xfree(scan_env->mem_env_dynamic);

  *rroot = NULL_NODE;
  return r;
}